

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

Iterator __thiscall
HashMap<int,_int>::insert(HashMap<int,_int> *this,Iterator *position,int *key,int *value)

{
  int iVar1;
  Item *pIVar2;
  Iterator IVar3;
  Item **ppIVar4;
  ItemBlock *pIVar5;
  Item *pIVar6;
  Iterator *pIVar7;
  ulong uVar8;
  
  IVar3 = find(this,key);
  if (IVar3.item == (this->_end).item) {
    if (this->data == (Item **)0x0) {
      uVar8 = this->capacity << 3;
      ppIVar4 = (Item **)operator_new__(uVar8);
      this->data = ppIVar4;
      Memory::zero(ppIVar4,uVar8);
    }
    IVar3.item = this->freeItem;
    if (IVar3.item == (Item *)0x0) {
      pIVar5 = (ItemBlock *)operator_new__(0xa8);
      pIVar5->next = this->blocks;
      this->blocks = pIVar5;
      pIVar6 = (Item *)0x0;
      for (uVar8 = 0x30; uVar8 < 0xa8; uVar8 = uVar8 + 0x28) {
        *(Item **)((long)&pIVar5[3].next + uVar8) = pIVar6;
        pIVar6 = (Item *)((long)&pIVar5->next + uVar8);
      }
      IVar3.item = (Item *)(pIVar5 + 1);
    }
    else {
      pIVar6 = (IVar3.item)->prev;
    }
    this->freeItem = pIVar6;
    iVar1 = *key;
    (IVar3.item)->key = iVar1;
    (IVar3.item)->value = *value;
    ppIVar4 = this->data + (ulong)(long)iVar1 % this->capacity;
    (IVar3.item)->cell = ppIVar4;
    pIVar6 = *ppIVar4;
    (IVar3.item)->nextCell = pIVar6;
    if (pIVar6 != (Item *)0x0) {
      pIVar6->cell = &(IVar3.item)->nextCell;
    }
    *ppIVar4 = IVar3.item;
    pIVar6 = position->item;
    pIVar2 = pIVar6->prev;
    (IVar3.item)->prev = pIVar2;
    pIVar7 = (Iterator *)&pIVar2->next;
    if (pIVar2 == (Item *)0x0) {
      pIVar7 = &this->_begin;
    }
    pIVar7->item = IVar3.item;
    (IVar3.item)->next = pIVar6;
    pIVar6->prev = IVar3.item;
    this->_size = this->_size + 1;
  }
  else {
    (IVar3.item)->value = *value;
  }
  return (Iterator)IVar3.item;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Iterator it = find(key);
    if(it != _end)
    {
      *it = value;
      return it;
    }

    if(!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*) * capacity);
    }
    
    Item* item;
    if(freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for(Item* i = item + 1, * end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item) Item(key, value) == item);
#else
    new(item) Item(key, value);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;
    
    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }